

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void v_predictor_64xh(uint8_t *dst,ptrdiff_t stride,uint8_t *above,int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int local_fc;
  uint8_t *local_a0;
  int i;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  int height_local;
  uint8_t *above_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 8);
  uVar3 = *(undefined8 *)(above + 0x10);
  uVar4 = *(undefined8 *)(above + 0x18);
  uVar5 = *(undefined8 *)(above + 0x20);
  uVar6 = *(undefined8 *)(above + 0x28);
  uVar7 = *(undefined8 *)(above + 0x30);
  uVar8 = *(undefined8 *)(above + 0x38);
  local_a0 = dst;
  for (local_fc = 0; local_fc < height; local_fc = local_fc + 1) {
    *(undefined8 *)local_a0 = uVar1;
    *(undefined8 *)(local_a0 + 8) = uVar2;
    *(undefined8 *)(local_a0 + 0x10) = uVar3;
    *(undefined8 *)(local_a0 + 0x18) = uVar4;
    *(undefined8 *)(local_a0 + 0x20) = uVar5;
    *(undefined8 *)(local_a0 + 0x28) = uVar6;
    *(undefined8 *)(local_a0 + 0x30) = uVar7;
    *(undefined8 *)(local_a0 + 0x38) = uVar8;
    local_a0 = local_a0 + stride;
  }
  return;
}

Assistant:

static inline void v_predictor_64xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, int height) {
  const __m128i row0 = _mm_load_si128((__m128i const *)above);
  const __m128i row1 = _mm_load_si128((__m128i const *)(above + 16));
  const __m128i row2 = _mm_load_si128((__m128i const *)(above + 32));
  const __m128i row3 = _mm_load_si128((__m128i const *)(above + 48));
  for (int i = 0; i < height; ++i) {
    _mm_store_si128((__m128i *)dst, row0);
    _mm_store_si128((__m128i *)(dst + 16), row1);
    _mm_store_si128((__m128i *)(dst + 32), row2);
    _mm_store_si128((__m128i *)(dst + 48), row3);
    dst += stride;
  }
}